

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

Entry * __thiscall
Lib::
DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntryToInsert(DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                    *this,Unit **key)

{
  type tVar1;
  long *in_RSI;
  uint *in_RDI;
  bool bVar2;
  uint h2;
  Entry *res;
  int pos;
  uint h1;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_2c;
  uint local_20;
  Entry *local_8;
  
  ensureExpanded((DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  tVar1 = DefaultHash::hash<Kernel::Unit>
                    ((Unit *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  local_20 = tVar1 % in_RDI[4];
  local_8 = (Entry *)(*(long *)(in_RDI + 6) + (long)(int)local_20 * 0x18);
  if (((uint)(local_8->field_0)._infoData >> 2 == *in_RDI) && (local_8->_key != (Unit *)*in_RSI)) {
    (local_8->field_0)._infoData = (local_8->field_0)._infoData & 0xfffffffdU | 2;
    tVar1 = DefaultHash2::hash<Kernel::Unit>
                      ((Unit *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    local_2c = tVar1 % in_RDI[4];
    if (local_2c == 0) {
      local_2c = 1;
    }
    do {
      local_20 = (local_20 + local_2c) % in_RDI[4];
      local_8 = (Entry *)(*(long *)(in_RDI + 6) + (long)(int)local_20 * 0x18);
      bVar2 = false;
      if ((uint)(local_8->field_0)._infoData >> 2 == *in_RDI) {
        bVar2 = local_8->_key != (Unit *)*in_RSI;
      }
    } while (bVar2);
  }
  return local_8;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }